

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall
helics::CoreBroker::findAndNotifyPublicationTargets
          (CoreBroker *this,BasicHandleInfo *handleInfo,string *key)

{
  string_view name;
  bool bVar1;
  BrokerState BVar2;
  UnknownHandleManager *in_RSI;
  pair<helics::GlobalHandle,_unsigned_short> *sub_2;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
  *__range2;
  ActionMessage *in_stack_00000118;
  CoreBroker *in_stack_00000120;
  ActionMessage link;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *sub_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  Pubtargets;
  pair<helics::GlobalHandle,_unsigned_short> *sub;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
  *__range1;
  vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
  subHandles;
  string *in_stack_fffffffffffffcb8;
  UnknownHandleManager *in_stack_fffffffffffffcc0;
  undefined4 in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffccc;
  pair<helics::action_message_def::action_t,_helics::action_message_def::action_t>
  in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd8;
  undefined2 in_stack_fffffffffffffcdc;
  undefined2 in_stack_fffffffffffffcde;
  UnknownHandleManager *in_stack_fffffffffffffce0;
  __normal_iterator<std::pair<helics::GlobalHandle,_unsigned_short>_*,_std::vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
  local_240;
  undefined1 *local_238;
  GlobalHandle local_218;
  __sv_type local_210;
  uint32_t in_stack_fffffffffffffe1c;
  Time in_stack_fffffffffffffe20;
  uint32_t in_stack_fffffffffffffe2c;
  Time in_stack_fffffffffffffe30;
  Time in_stack_fffffffffffffe38;
  pair<helics::action_message_def::action_t,_helics::action_message_def::action_t>
  in_stack_fffffffffffffe40;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_138;
  undefined1 *local_130;
  undefined1 local_128 [40];
  undefined4 local_100;
  undefined4 local_fc;
  pair<helics::action_message_def::action_t,_helics::action_message_def::action_t> local_f8;
  BaseType local_f0;
  BaseType local_ec;
  reference local_50;
  pair<helics::GlobalHandle,_unsigned_short> *local_48;
  __normal_iterator<std::pair<helics::GlobalHandle,_unsigned_short>_*,_std::vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
  local_40;
  undefined1 *local_38;
  undefined1 local_30 [32];
  UnknownHandleManager *local_10;
  
  local_10 = in_RSI;
  UnknownHandleManager::checkForPublications
            ((UnknownHandleManager *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
             (string *)in_stack_fffffffffffffcc0);
  local_38 = local_30;
  local_40._M_current =
       (pair<helics::GlobalHandle,_unsigned_short> *)
       CLI::std::
       vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
       ::begin((vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                *)in_stack_fffffffffffffcb8);
  local_48 = (pair<helics::GlobalHandle,_unsigned_short> *)
             CLI::std::
             vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
             ::end((vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                    *)in_stack_fffffffffffffcb8);
  while (bVar1 = __gnu_cxx::
                 operator==<std::pair<helics::GlobalHandle,_unsigned_short>_*,_std::vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
                           ((__normal_iterator<std::pair<helics::GlobalHandle,_unsigned_short>_*,_std::vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
                             *)in_stack_fffffffffffffcc0,
                            (__normal_iterator<std::pair<helics::GlobalHandle,_unsigned_short>_*,_std::vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
                             *)in_stack_fffffffffffffcb8), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_50 = __gnu_cxx::
               __normal_iterator<std::pair<helics::GlobalHandle,_unsigned_short>_*,_std::vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
               ::operator*(&local_40);
    local_ec = (local_50->first).fed_id.gid;
    local_f0 = (local_50->first).handle.hid;
    in_stack_fffffffffffffce0 = local_10;
    BasicHandleInfo::BasicHandleInfo
              ((BasicHandleInfo *)
               CONCAT26(in_stack_fffffffffffffcde,
                        CONCAT24(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8)),
               (GlobalFederateId)(BaseType)((ulong)local_10 >> 0x20),
               (InterfaceHandle)(BaseType)local_10,in_stack_fffffffffffffcd0.second._3_1_);
    local_fc = 0x32;
    local_100 = 0x46;
    local_f8 = std::
               make_pair<helics::action_message_def::action_t,helics::action_message_def::action_t>
                         ((action_t *)in_stack_fffffffffffffcb8,(action_t *)0x5f62ea);
    connectInterfaces((CoreBroker *)in_stack_fffffffffffffe38.internalTimeCode,
                      (BasicHandleInfo *)in_stack_fffffffffffffe30.internalTimeCode,
                      in_stack_fffffffffffffe2c,
                      (BasicHandleInfo *)in_stack_fffffffffffffe20.internalTimeCode,
                      in_stack_fffffffffffffe1c,in_stack_fffffffffffffe40);
    BasicHandleInfo::~BasicHandleInfo((BasicHandleInfo *)in_stack_fffffffffffffcc0);
    __gnu_cxx::
    __normal_iterator<std::pair<helics::GlobalHandle,_unsigned_short>_*,_std::vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
    ::operator++(&local_40);
  }
  UnknownHandleManager::checkForLinks
            ((UnknownHandleManager *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
             (string *)in_stack_fffffffffffffcc0);
  local_130 = local_128;
  local_138._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       CLI::std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffcb8);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)in_stack_fffffffffffffcb8);
  while (bVar1 = __gnu_cxx::
                 operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffcc0,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffcb8), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator*(&local_138);
    ActionMessage::ActionMessage
              ((ActionMessage *)in_stack_fffffffffffffce0,
               CONCAT22(in_stack_fffffffffffffcde,in_stack_fffffffffffffcdc));
    local_210 = std::__cxx11::string::operator_cast_to_basic_string_view
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffcc0);
    name._M_str = (char *)in_stack_fffffffffffffcc0;
    name._M_len = (size_t)in_stack_fffffffffffffcb8;
    ActionMessage::name((ActionMessage *)0x5f644d,name);
    local_218 = (GlobalHandle)(local_10->unknown_publications)._M_h._M_buckets;
    ActionMessage::setSource((ActionMessage *)&stack0xfffffffffffffe00,local_218);
    checkForNamedInterface(in_stack_00000120,in_stack_00000118);
    ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffcc0);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_138);
  }
  bVar1 = CLI::std::
          vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
          ::empty((vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                   *)in_stack_fffffffffffffcd0);
  if ((!bVar1) ||
     (bVar1 = CLI::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffcd0), !bVar1)) {
    UnknownHandleManager::clearPublication(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  }
  BVar2 = BrokerBase::getBrokerState((BrokerBase *)0x5f6553);
  if (BVar2 == OPERATING) {
    UnknownHandleManager::checkForReconnectionPublications
              ((UnknownHandleManager *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8)
               ,(string *)in_stack_fffffffffffffcc0);
    CLI::std::
    vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
    ::operator=((vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                 *)in_stack_fffffffffffffcd0,
                (vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                 *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
    CLI::std::
    vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
    ::~vector((vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
               *)in_stack_fffffffffffffcd0);
    local_238 = local_30;
    local_240._M_current =
         (pair<helics::GlobalHandle,_unsigned_short> *)
         CLI::std::
         vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
         ::begin((vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                  *)in_stack_fffffffffffffcb8);
    CLI::std::
    vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
    ::end((vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
           *)in_stack_fffffffffffffcb8);
    while (bVar1 = __gnu_cxx::
                   operator==<std::pair<helics::GlobalHandle,_unsigned_short>_*,_std::vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
                             ((__normal_iterator<std::pair<helics::GlobalHandle,_unsigned_short>_*,_std::vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
                               *)in_stack_fffffffffffffcc0,
                              (__normal_iterator<std::pair<helics::GlobalHandle,_unsigned_short>_*,_std::vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
                               *)in_stack_fffffffffffffcb8), ((bVar1 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::
      __normal_iterator<std::pair<helics::GlobalHandle,_unsigned_short>_*,_std::vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
      ::operator*(&local_240);
      in_stack_fffffffffffffcc0 = local_10;
      BasicHandleInfo::BasicHandleInfo
                ((BasicHandleInfo *)
                 CONCAT26(BVar2,CONCAT24(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8)),
                 (GlobalFederateId)(BaseType)((ulong)in_stack_fffffffffffffce0 >> 0x20),
                 (InterfaceHandle)(BaseType)in_stack_fffffffffffffce0,
                 in_stack_fffffffffffffcd0.second._3_1_);
      in_stack_fffffffffffffcd0 =
           std::make_pair<helics::action_message_def::action_t,helics::action_message_def::action_t>
                     ((action_t *)in_stack_fffffffffffffcb8,(action_t *)0x5f6695);
      connectInterfaces((CoreBroker *)in_stack_fffffffffffffe38.internalTimeCode,
                        (BasicHandleInfo *)in_stack_fffffffffffffe30.internalTimeCode,
                        in_stack_fffffffffffffe2c,
                        (BasicHandleInfo *)in_stack_fffffffffffffe20.internalTimeCode,
                        in_stack_fffffffffffffe1c,in_stack_fffffffffffffe40);
      BasicHandleInfo::~BasicHandleInfo((BasicHandleInfo *)in_stack_fffffffffffffcc0);
      __gnu_cxx::
      __normal_iterator<std::pair<helics::GlobalHandle,_unsigned_short>_*,_std::vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
      ::operator++(&local_240);
    }
  }
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffcd0);
  CLI::std::
  vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
  ::~vector((vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
             *)in_stack_fffffffffffffcd0);
  return;
}

Assistant:

void CoreBroker::findAndNotifyPublicationTargets(BasicHandleInfo& handleInfo,
                                                 const std::string& key)
{
    auto subHandles = unknownHandles.checkForPublications(key);
    for (const auto& sub : subHandles) {
        connectInterfaces(handleInfo,
                          sub.second,
                          BasicHandleInfo(sub.first.fed_id, sub.first.handle, InterfaceType::INPUT),

                          handleInfo.flags,
                          std::make_pair(CMD_ADD_PUBLISHER, CMD_ADD_SUBSCRIBER));
    }

    auto Pubtargets = unknownHandles.checkForLinks(key);
    for (const auto& sub : Pubtargets) {
        ActionMessage link(CMD_ADD_NAMED_INPUT);
        link.name(sub);
        link.setSource(handleInfo.handle);
        checkForNamedInterface(link);
    }
    if (!(subHandles.empty() && Pubtargets.empty())) {
        unknownHandles.clearPublication(key);
    }
    if (getBrokerState() == BrokerState::OPERATING) {
        subHandles = unknownHandles.checkForReconnectionPublications(key);
        for (const auto& sub : subHandles) {
            connectInterfaces(handleInfo,
                              sub.second,
                              BasicHandleInfo(sub.first.fed_id,
                                              sub.first.handle,
                                              InterfaceType::INPUT),

                              handleInfo.flags,
                              std::make_pair(CMD_ADD_PUBLISHER, CMD_ADD_SUBSCRIBER));
        }
    }
}